

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::MergePartialFromCodedStream
          (ImageFeatureType_ImageSizeRange *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  SizeRange *value;
  ulong uVar6;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0017f666;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0017f666:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    uVar4 = (uint32)uVar6;
    if ((uVar6 & 0x100000000) == 0) {
LAB_0017f6c1:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
    }
    else {
      uVar5 = (uint)(uVar6 >> 3) & 0x1fffffff;
      if (uVar5 == 2) {
        if ((char)uVar6 != '\x12') goto LAB_0017f6c1;
        value = mutable_heightrange(this);
      }
      else {
        if ((uVar5 != 1) || ((char)uVar6 != '\n')) goto LAB_0017f6c1;
        value = mutable_widthrange(this);
      }
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::SizeRange>(input,value);
    }
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ImageFeatureType_ImageSizeRange::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.SizeRange widthRange = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_widthrange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SizeRange heightRange = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_heightrange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  return false;
#undef DO_
}